

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Type> *
wasm::WATParser::tupletype<wasm::WATParser::ParseTypeDefsCtx>
          (MaybeResult<wasm::Type> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  undefined1 uVar1;
  bool bVar2;
  TypeT TVar3;
  string_view expected;
  string local_110 [32];
  undefined1 local_f0 [8];
  Result<wasm::Type> _val;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_a8;
  undefined1 local_90 [8];
  Result<wasm::Type> elem;
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  ulong local_40;
  
  this = &ctx->in;
  expected._M_str = "tuple";
  expected._M_len = 5;
  bVar2 = Lexer::takeSExprStart(this,expected);
  if (bVar2) {
    elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_index = '\0';
    elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._33_7_ = 0;
    local_40 = 0;
    do {
      bVar2 = Lexer::takeRParen(this);
      if (bVar2) {
        if (local_40 < 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                     "tuples must have at least two elements",(allocator<char> *)local_f0);
          Lexer::err((Err *)local_90,this,
                     (string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Type,wasm::None,wasm::Err> *)
                     __return_storage_ptr__,local_90);
          std::__cxx11::string::~string((string *)local_90);
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        }
        else {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_a8,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     ((long)&elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          TVar3 = ParseTypeDefsCtx::makeTupleType
                            (ctx,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_a8);
          *(uintptr_t *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> = TVar3.id;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\0';
          std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_a8);
        }
        break;
      }
      singlevaltype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Type> *)local_90,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_f0,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_90);
      uVar1 = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string(local_110,(string *)local_f0);
        std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Type,wasm::None,wasm::Err> *)__return_storage_ptr__
                   ,local_110);
        std::__cxx11::string::~string(local_110);
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_f0);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_f0);
        TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendTupleElem
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                   (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                   ((long)&elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),(Type)local_90);
        local_40 = local_40 + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_90);
    } while (uVar1 != '\x01');
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
               ((long)&elem.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::TypeT> tupletype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("tuple"sv)) {
    return {};
  }
  auto elems = ctx.makeTupleElemList();
  size_t numElems = 0;
  while (!ctx.in.takeRParen()) {
    auto elem = singlevaltype(ctx);
    CHECK_ERR(elem);
    ctx.appendTupleElem(elems, *elem);
    ++numElems;
  }
  if (numElems < 2) {
    return ctx.in.err("tuples must have at least two elements");
  }
  return ctx.makeTupleType(elems);
}